

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall
cs::repl::interpret(repl *this,string *code,
                   deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *line)

{
  context_t *pcVar1;
  method_base **ppmVar2;
  method_base **ppmVar3;
  element_type *peVar4;
  pointer paVar5;
  undefined *puVar6;
  int iVar7;
  method_base *pmVar8;
  domain_type *domain_00;
  long *plVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error *peVar10;
  runtime_error *prVar11;
  method_base *pmVar12;
  any *it_3;
  long lVar13;
  any *it;
  any *this_00;
  any *it_1;
  domain_type domain;
  undefined1 local_148 [32];
  _Elt_pointer local_128;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  CStack_120;
  _Elt_pointer local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  _Elt_pointer local_108;
  pointer paStack_100;
  undefined1 local_e0 [80];
  undefined1 local_90 [96];
  undefined4 extraout_var;
  
  pcVar1 = &this->context;
  pmVar8 = translator_type::match
                     (&((((this->context).
                          super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->translator,line);
  iVar7 = (*pmVar8->_vptr_method_base[2])(pmVar8);
  switch(iVar7) {
  case 0:
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Null type of grammar.","");
    runtime_error::runtime_error(prVar11,(string *)local_148);
    __cxa_throw(prVar11,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 1:
    ppmVar3 = (this->methods).m_current;
    ppmVar2 = (this->methods).m_start;
    iVar7 = (*pmVar8->_vptr_method_base[3])(pmVar8);
    if (ppmVar3 == ppmVar2) {
      if (iVar7 == 0x19) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,"Hanging end statement.","");
        runtime_error::runtime_error(prVar11,(string *)local_148);
        __cxa_throw(prVar11,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
      local_108 = (_Elt_pointer)0x0;
      paStack_100 = (pointer)0x0;
      local_118 = (_Elt_pointer)0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128 = (_Elt_pointer)0x0;
      CStack_120.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                  )0x0;
      local_148._16_8_ = (_Elt_pointer)0x0;
      local_148._24_8_ = (_Elt_pointer)0x0;
      local_148._0_8_ = (_Map_pointer)0x0;
      local_148._8_8_ = (slot_type *)0x0;
      std::
      deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
      ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                  *)local_148,local_e0,local_90);
      (*pmVar8->_vptr_method_base[4])(pmVar8,pcVar1,local_148);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)local_148);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
      local_108 = (_Elt_pointer)0x0;
      paStack_100 = (pointer)0x0;
      local_118 = (_Elt_pointer)0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128 = (_Elt_pointer)0x0;
      CStack_120.
      super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
      .
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
      .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                  )0x0;
      local_148._16_8_ = (_Elt_pointer)0x0;
      local_148._24_8_ = (_Elt_pointer)0x0;
      local_148._0_8_ = (_Map_pointer)0x0;
      local_148._8_8_ = (slot_type *)0x0;
      std::
      deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
      ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
                ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                  *)local_148,local_e0,local_90);
      iVar7 = (*pmVar8->_vptr_method_base[5])(pmVar8,pcVar1,local_148);
      plVar9 = (long *)CONCAT44(extraout_var,iVar7);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)local_148);
      std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
      goto LAB_002517b8;
    }
    if (iVar7 == 0x19) {
      stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
      ::pop_no_return(&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->instance).
                         super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       super_runtime_type).storage.m_set);
      domain_00 = domain_manager::get_domain
                            (&(((((pcVar1->
                                  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr)->instance).
                                super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->super_runtime_type).storage);
      domain_type::domain_type((domain_type *)local_148,domain_00);
      domain_manager::remove_domain
                (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->instance).
                    super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_runtime_type).storage);
      ppmVar3 = (this->methods).m_current;
      if (ppmVar3 == (this->methods).m_start) {
        peVar10 = (error *)__cxa_allocate_exception(0x28);
        local_e0._0_8_ = local_e0 + 0x10;
        local_e0._16_4_ = 0x30303045;
        local_e0._20_2_ = 0x48;
        local_e0._8_8_ = 5;
        cov::error::error(peVar10,(string *)local_e0);
        __cxa_throw(peVar10,&cov::error::typeinfo,cov::error::~error);
      }
      pmVar12 = ppmVar3[-1];
      (*pmVar12->_vptr_method_base[6])(pmVar12,pcVar1,local_148);
      ppmVar3 = (this->methods).m_current;
      if (ppmVar3 == (this->methods).m_start) {
        peVar10 = (error *)__cxa_allocate_exception(0x28);
        local_e0._0_8_ = local_e0 + 0x10;
        local_e0._16_4_ = 0x30303045;
        local_e0._20_2_ = 0x48;
        local_e0._8_8_ = 5;
        cov::error::error(peVar10,(string *)local_e0);
        __cxa_throw(peVar10,&cov::error::typeinfo,cov::error::~error);
      }
      pmVar12 = ppmVar3[-1];
      (this->methods).m_current = ppmVar3 + -1;
      domain_type::~domain_type((domain_type *)local_148);
    }
    else {
      pmVar12 = (method_base *)0x0;
    }
    if ((this->methods).m_current == (this->methods).m_start) {
      iVar7 = (*pmVar8->_vptr_method_base[3])(pmVar8);
      if (iVar7 == 0x19) {
        iVar7 = (*pmVar8->_vptr_method_base[7])(pmVar8,pmVar12,pcVar1,this,line);
        plVar9 = (long *)CONCAT44(extraout_var_00,iVar7);
      }
      else {
        iVar7 = (*pmVar12->_vptr_method_base[5])(pmVar12,pcVar1,this);
        plVar9 = (long *)CONCAT44(extraout_var_01,iVar7);
      }
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::clear(&this->tmp);
      goto LAB_002517b8;
    }
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    local_108 = (_Elt_pointer)0x0;
    paStack_100 = (pointer)0x0;
    local_118 = (_Elt_pointer)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (_Elt_pointer)0x0;
    CStack_120.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                )0x0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    local_148._24_8_ = (_Elt_pointer)0x0;
    local_148._0_8_ = (_Map_pointer)0x0;
    local_148._8_8_ = (slot_type *)0x0;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)local_148,local_e0,local_90);
    (*pmVar8->_vptr_method_base[4])(pmVar8,pcVar1,local_148);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_148);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back(&this->tmp,line);
    break;
  case 2:
    ppmVar3 = (this->methods).m_current;
    if ((long)ppmVar3 - (long)(this->methods).m_start >> 3 == (this->methods).m_size) {
      peVar10 = (error *)__cxa_allocate_exception(0x28);
      local_148._0_8_ = local_148 + 0x10;
      local_148._16_6_ = 0x4930303045;
      local_148._8_8_ = (slot_type *)0x5;
      cov::error::error(peVar10,(string *)local_148);
      __cxa_throw(peVar10,&cov::error::typeinfo,cov::error::~error);
    }
    (this->methods).m_current = ppmVar3 + 1;
    *ppmVar3 = pmVar8;
    domain_manager::add_domain
              (&(((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
    domain_manager::add_set
              (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage);
    ppmVar3 = (this->methods).m_current;
    if (ppmVar3 == (this->methods).m_start) {
      peVar10 = (error *)__cxa_allocate_exception(0x28);
      local_148._0_8_ = local_148 + 0x10;
      local_148._16_6_ = 0x4830303045;
      local_148._8_8_ = (slot_type *)0x5;
      cov::error::error(peVar10,(string *)local_148);
      __cxa_throw(peVar10,&cov::error::typeinfo,cov::error::~error);
    }
    pmVar8 = ppmVar3[-1];
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    local_108 = (_Elt_pointer)0x0;
    paStack_100 = (pointer)0x0;
    local_118 = (_Elt_pointer)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (_Elt_pointer)0x0;
    CStack_120.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                )0x0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    local_148._24_8_ = (_Elt_pointer)0x0;
    local_148._0_8_ = (_Map_pointer)0x0;
    local_148._8_8_ = (slot_type *)0x0;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)local_148,local_e0,local_90);
    (*pmVar8->_vptr_method_base[4])(pmVar8,pcVar1,local_148);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_148);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::push_back(&this->tmp,line);
    break;
  case 3:
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0,line);
    local_108 = (_Elt_pointer)0x0;
    paStack_100 = (pointer)0x0;
    local_118 = (_Elt_pointer)0x0;
    _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128 = (_Elt_pointer)0x0;
    CStack_120.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                )0x0;
    local_148._16_8_ = (_Elt_pointer)0x0;
    local_148._24_8_ = (_Elt_pointer)0x0;
    local_148._0_8_ = (_Map_pointer)0x0;
    local_148._8_8_ = (slot_type *)0x0;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::_M_range_initialize<std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)local_148,local_e0,local_90);
    (*pmVar8->_vptr_method_base[5])(pmVar8,pcVar1,local_148);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_148);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_e0);
  }
  plVar9 = (long *)0x0;
LAB_002517b8:
  puVar6 = current_process;
  if (plVar9 != (long *)0x0) {
    if (this->echo == true) {
      lVar13 = 0x20;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
      }
    }
    else {
      lVar13 = 0x18;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
      }
    }
    (**(code **)(*plVar9 + lVar13))(plVar9);
  }
  peVar4 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar5 = (peVar4->constant_pool).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = *(any **)&(peVar4->constant_pool).
                           super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>;
      this_00 != paVar5; this_00 = this_00 + 1) {
    cs_impl::any::constant(this_00);
  }
  domain_manager::clear_set
            (&(((((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->super_runtime_type).storage);
  return;
}

Assistant:

void repl::interpret(const string &code, std::deque<token_base *> &line)
	{
		statement_base *sptr = nullptr;
		try {
			method_base *m = context->compiler->match_method(line);
			switch (m->get_type()) {
			case method_types::null:
				throw runtime_error("Null type of grammar.");
				break;
			case method_types::single: {
				if (!methods.empty()) {
					method_base *expected_method = nullptr;
					if (m->get_target_type() == statement_types::end_) {
						context->instance->storage.remove_set();
						domain_type domain = std::move(context->instance->storage.get_domain());
						context->instance->storage.remove_domain();
						methods.top()->postprocess(context, domain);
						expected_method = methods.top();
						methods.pop();
					}
					if (methods.empty()) {
						if (m->get_target_type() == statement_types::end_)
							sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
							        line);
						else
							sptr = expected_method->translate(context, tmp);
						tmp.clear();
					}
					else {
						m->preprocess(context, {line});
						tmp.push_back(line);
					}
				}
				else {
					if (m->get_target_type() == statement_types::end_)
						throw runtime_error("Hanging end statement.");
					else {
						m->preprocess(context, {line});
						sptr = m->translate(context, {line});
					}
				}
			}
			break;
			case method_types::block: {
				methods.push(m);
				context->instance->storage.add_domain();
				context->instance->storage.add_set();
				methods.top()->preprocess(context, {line});
				tmp.push_back(line);
			}
			break;
			case method_types::jit_command:
				m->translate(context, {line});
				break;
			}
			if (sptr != nullptr)
				echo ? sptr->repl_run() : sptr->run();
		}
		catch (const lang_error &le) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw fatal_error(std::string("Uncaught exception: ") + le.what());
		}
		catch (const cs::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw e;
		}
		catch (const std::exception &e) {
			reset_status();
			context->compiler->utilize_metadata();
			context->instance->storage.clear_set();
			throw exception(line_num, context->file_path, code, e.what());
		}
		context->compiler->utilize_metadata();
		context->instance->storage.clear_set();
	}